

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O1

ostream * __thiscall
boost::unit_test::
lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
::operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
             *this,ostream *ostr)

{
  int iVar1;
  undefined4 extraout_var;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar1 = (*this->m_prev->_vptr_lazy_ostream[2])();
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,this->m_value->m_begin,this->m_value->m_end);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var,iVar1),(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return (ostream *)CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }